

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Validator::Validator(Validator *this,string *validator_desc)

{
  string *in_RSI;
  long in_RDI;
  string *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  this_00 = local_30;
  ::std::__cxx11::string::string(this_00,in_RSI);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_ffffffffffffffc0,(anon_class_32_1_5ff8519c *)this_00);
  Validator(std::__cxx11::string)::{lambda()#1}::~basic_string((anon_class_32_1_5ff8519c *)0x12fcb2)
  ;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Validator::func_::_lambda(std::__cxx11::string&)_1_,void>
            (in_stack_ffffffffffffffc0,(anon_class_1_0_00000001 *)this_00);
  ::std::__cxx11::string::string((string *)(in_RDI + 0x40));
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  *(undefined1 *)(in_RDI + 100) = 1;
  *(undefined1 *)(in_RDI + 0x65) = 0;
  return;
}

Assistant:

explicit Validator(std::string validator_desc) : desc_function_([validator_desc]() { return validator_desc; }) {}